

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strex.cc
# Opt level: O1

int ASN1_STRING_print(BIO *bp,ASN1_STRING *v)

{
  uchar uVar1;
  uchar *puVar2;
  bool bVar3;
  uchar uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  char buf [80];
  uchar local_88 [88];
  
  if (v == (ASN1_STRING *)0x0) {
    iVar5 = 0;
  }
  else {
    if (v->length < 1) {
      iVar5 = 0;
    }
    else {
      puVar2 = v->data;
      lVar7 = 0;
      iVar5 = 0;
      do {
        uVar1 = puVar2[lVar7];
        uVar4 = '.';
        if ((uVar1 != '\x7f') && (uVar4 = uVar1, (char)uVar1 < ' ')) {
          uVar4 = '.';
          if (uVar1 == '\n') {
            uVar4 = '\n';
          }
          if (uVar1 == '\r') {
            uVar4 = '\r';
          }
        }
        local_88[iVar5] = uVar4;
        iVar6 = iVar5 + 1;
        bVar3 = 0x4e < iVar5;
        iVar5 = iVar6;
        if (bVar3) {
          iVar6 = BIO_write(bp,local_88,iVar6);
          iVar5 = 0;
          if (iVar6 < 1) {
            return 0;
          }
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < v->length);
    }
    if ((iVar5 < 1) || (iVar5 = BIO_write(bp,local_88,iVar5), 0 < iVar5)) {
      iVar5 = 1;
    }
    else {
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int ASN1_STRING_print(BIO *bp, const ASN1_STRING *v) {
  int i, n;
  char buf[80];
  const char *p;

  if (v == NULL) {
    return 0;
  }
  n = 0;
  p = (const char *)v->data;
  for (i = 0; i < v->length; i++) {
    if ((p[i] > '~') || ((p[i] < ' ') && (p[i] != '\n') && (p[i] != '\r'))) {
      buf[n] = '.';
    } else {
      buf[n] = p[i];
    }
    n++;
    if (n >= 80) {
      if (BIO_write(bp, buf, n) <= 0) {
        return 0;
      }
      n = 0;
    }
  }
  if (n > 0) {
    if (BIO_write(bp, buf, n) <= 0) {
      return 0;
    }
  }
  return 1;
}